

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O1

ssize_t __thiscall
tiger::trains::network::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *pvVar2;
  
  if (__buf == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)0x0;
    do {
      sVar1 = TCPSocket::send(&this->tcpSocket,__fd + (int)pvVar2,
                              (void *)((long)__buf - (long)pvVar2),__n,__flags);
      if ((int)sVar1 == -1) {
        pvVar2 = (void *)0xffffffffffffffff;
        break;
      }
      pvVar2 = (void *)((long)pvVar2 + (long)(int)sVar1);
    } while (pvVar2 < __buf);
  }
  return (ulong)pvVar2 & 0xffffffff;
}

Assistant:

int TCPClient::send(const char *buffer, size_t bufferSize)
{
    size_t sent = 0;
    int lastSent = 0;

    while (sent < bufferSize)
    {
        lastSent = tcpSocket.send(buffer + sent, bufferSize - sent);

        if (lastSent == -1) break;

        sent += lastSent;
    }

    return lastSent == -1 ? -1 : sent;
}